

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_create_compiler_options(spvc_compiler compiler,spvc_compiler_options *options)

{
  spvc_backend sVar1;
  spvc_context_s *this;
  spvc_context psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  VertexOptions VVar10;
  undefined1 uVar11;
  uint32_t uVar12;
  bool bVar13;
  bool bVar14;
  undefined2 uVar15;
  uint32_t uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  spvc_compiler_options_s *this_00;
  pointer psVar22;
  CompilerGLSL *pCVar23;
  Options *pOVar24;
  CompilerMSL *this_01;
  Options *__src;
  CompilerHLSL *this_02;
  Options *pOVar25;
  pointer local_a8;
  exception *e;
  int local_68;
  allocator local_61;
  string local_60;
  undefined1 local_29;
  unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_> local_28;
  unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_> opt;
  spvc_compiler_options *options_local;
  spvc_compiler compiler_local;
  
  opt._M_t.
  super___uniq_ptr_impl<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>._M_t
  .super__Tuple_impl<0UL,_spvc_compiler_options_s_*,_std::default_delete<spvc_compiler_options_s>_>.
  super__Head_base<0UL,_spvc_compiler_options_s_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>,_true,_true>
        )(__uniq_ptr_data<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>,_true,_true>
          )options;
  this_00 = (spvc_compiler_options_s *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
  local_29 = 0;
  local_a8 = (pointer)0x0;
  if (this_00 != (spvc_compiler_options_s *)0x0) {
    local_29 = 1;
    spvc_compiler_options_s::spvc_compiler_options_s(this_00);
    local_a8 = this_00;
  }
  std::unique_ptr<spvc_compiler_options_s,std::default_delete<spvc_compiler_options_s>>::
  unique_ptr<std::default_delete<spvc_compiler_options_s>,void>
            ((unique_ptr<spvc_compiler_options_s,std::default_delete<spvc_compiler_options_s>> *)
             &local_28,local_a8);
  bVar21 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (bVar21) {
    psVar2 = compiler->context;
    psVar22 = std::
              unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
              operator->(&local_28);
    psVar22->context = psVar2;
    psVar22 = std::
              unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
              operator->(&local_28);
    psVar22->backend_flags = 0;
    sVar1 = compiler->backend;
    if (sVar1 == SPVC_BACKEND_GLSL) {
      psVar22 = std::
                unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
                operator->(&local_28);
      *(byte *)((long)&psVar22->backend_flags + 3) =
           *(byte *)((long)&psVar22->backend_flags + 3) | 3;
      pCVar23 = (CompilerGLSL *)
                std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                ::get(&compiler->compiler);
      pOVar24 = spirv_cross::CompilerGLSL::get_common_options(pCVar23);
      psVar22 = std::
                unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
                operator->(&local_28);
      memcpy(&psVar22->glsl,pOVar24,0x28);
    }
    else if (sVar1 == SPVC_BACKEND_HLSL) {
      psVar22 = std::
                unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
                operator->(&local_28);
      *(byte *)((long)&psVar22->backend_flags + 3) =
           *(byte *)((long)&psVar22->backend_flags + 3) | 5;
      pCVar23 = (CompilerGLSL *)
                std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                ::get(&compiler->compiler);
      pOVar24 = spirv_cross::CompilerGLSL::get_common_options(pCVar23);
      psVar22 = std::
                unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
                operator->(&local_28);
      (psVar22->glsl).fragment = pOVar24->fragment;
      uVar12 = pOVar24->version;
      bVar13 = pOVar24->es;
      bVar14 = pOVar24->force_temporary;
      uVar15 = *(undefined2 *)&pOVar24->field_0x6;
      uVar16 = pOVar24->force_recompile_max_debug_iterations;
      bVar17 = pOVar24->vulkan_semantics;
      bVar18 = pOVar24->separate_shader_objects;
      bVar19 = pOVar24->flatten_multidimensional_arrays;
      bVar20 = pOVar24->enable_420pack_extension;
      bVar21 = pOVar24->emit_uniform_buffer_as_plain_uniforms;
      bVar3 = pOVar24->emit_line_directives;
      bVar4 = pOVar24->enable_storage_image_qualifier_deduction;
      bVar5 = pOVar24->force_zero_initialized_variables;
      bVar6 = pOVar24->force_flattened_io_blocks;
      bVar7 = pOVar24->relax_nan_checks;
      bVar8 = pOVar24->enable_row_major_load_workaround;
      uVar9 = pOVar24->ovr_multiview_view_count;
      VVar10 = pOVar24->vertex;
      uVar11 = pOVar24->field_0x1f;
      (psVar22->glsl).emit_push_constant_as_uniform_buffer =
           pOVar24->emit_push_constant_as_uniform_buffer;
      (psVar22->glsl).emit_uniform_buffer_as_plain_uniforms = bVar21;
      (psVar22->glsl).emit_line_directives = bVar3;
      (psVar22->glsl).enable_storage_image_qualifier_deduction = bVar4;
      (psVar22->glsl).force_zero_initialized_variables = bVar5;
      (psVar22->glsl).force_flattened_io_blocks = bVar6;
      (psVar22->glsl).relax_nan_checks = bVar7;
      (psVar22->glsl).enable_row_major_load_workaround = bVar8;
      (psVar22->glsl).ovr_multiview_view_count = uVar9;
      (psVar22->glsl).vertex = VVar10;
      (psVar22->glsl).field_0x1f = uVar11;
      (psVar22->glsl).version = uVar12;
      (psVar22->glsl).es = bVar13;
      (psVar22->glsl).force_temporary = bVar14;
      *(undefined2 *)&(psVar22->glsl).field_0x6 = uVar15;
      (psVar22->glsl).force_recompile_max_debug_iterations = uVar16;
      (psVar22->glsl).vulkan_semantics = bVar17;
      (psVar22->glsl).separate_shader_objects = bVar18;
      (psVar22->glsl).flatten_multidimensional_arrays = bVar19;
      (psVar22->glsl).enable_420pack_extension = bVar20;
      this_02 = (CompilerHLSL *)
                std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                ::get(&compiler->compiler);
      pOVar25 = spirv_cross::CompilerHLSL::get_hlsl_options(this_02);
      psVar22 = std::
                unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
                operator->(&local_28);
      bVar21 = pOVar25->point_size_compat;
      bVar3 = pOVar25->point_coord_compat;
      bVar4 = pOVar25->support_nonzero_base_vertex_base_instance;
      bVar5 = pOVar25->force_storage_buffer_as_uav;
      (psVar22->hlsl).shader_model = pOVar25->shader_model;
      (psVar22->hlsl).point_size_compat = bVar21;
      (psVar22->hlsl).point_coord_compat = bVar3;
      (psVar22->hlsl).support_nonzero_base_vertex_base_instance = bVar4;
      (psVar22->hlsl).force_storage_buffer_as_uav = bVar5;
      bVar21 = pOVar25->enable_16bit_types;
      bVar3 = pOVar25->flatten_matrix_vertex_input_semantics;
      bVar4 = pOVar25->use_entry_point_name;
      (psVar22->hlsl).nonwritable_uav_texture_as_srv = pOVar25->nonwritable_uav_texture_as_srv;
      (psVar22->hlsl).enable_16bit_types = bVar21;
      (psVar22->hlsl).flatten_matrix_vertex_input_semantics = bVar3;
      (psVar22->hlsl).use_entry_point_name = bVar4;
      (psVar22->hlsl).preserve_structured_buffers = pOVar25->preserve_structured_buffers;
    }
    else if (sVar1 == SPVC_BACKEND_MSL) {
      psVar22 = std::
                unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
                operator->(&local_28);
      *(byte *)((long)&psVar22->backend_flags + 3) =
           *(byte *)((long)&psVar22->backend_flags + 3) | 9;
      pCVar23 = (CompilerGLSL *)
                std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                ::get(&compiler->compiler);
      pOVar24 = spirv_cross::CompilerGLSL::get_common_options(pCVar23);
      psVar22 = std::
                unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
                operator->(&local_28);
      (psVar22->glsl).fragment = pOVar24->fragment;
      uVar12 = pOVar24->version;
      bVar13 = pOVar24->es;
      bVar14 = pOVar24->force_temporary;
      uVar15 = *(undefined2 *)&pOVar24->field_0x6;
      uVar16 = pOVar24->force_recompile_max_debug_iterations;
      bVar17 = pOVar24->vulkan_semantics;
      bVar18 = pOVar24->separate_shader_objects;
      bVar19 = pOVar24->flatten_multidimensional_arrays;
      bVar20 = pOVar24->enable_420pack_extension;
      bVar21 = pOVar24->emit_uniform_buffer_as_plain_uniforms;
      bVar3 = pOVar24->emit_line_directives;
      bVar4 = pOVar24->enable_storage_image_qualifier_deduction;
      bVar5 = pOVar24->force_zero_initialized_variables;
      bVar6 = pOVar24->force_flattened_io_blocks;
      bVar7 = pOVar24->relax_nan_checks;
      bVar8 = pOVar24->enable_row_major_load_workaround;
      uVar9 = pOVar24->ovr_multiview_view_count;
      VVar10 = pOVar24->vertex;
      uVar11 = pOVar24->field_0x1f;
      (psVar22->glsl).emit_push_constant_as_uniform_buffer =
           pOVar24->emit_push_constant_as_uniform_buffer;
      (psVar22->glsl).emit_uniform_buffer_as_plain_uniforms = bVar21;
      (psVar22->glsl).emit_line_directives = bVar3;
      (psVar22->glsl).enable_storage_image_qualifier_deduction = bVar4;
      (psVar22->glsl).force_zero_initialized_variables = bVar5;
      (psVar22->glsl).force_flattened_io_blocks = bVar6;
      (psVar22->glsl).relax_nan_checks = bVar7;
      (psVar22->glsl).enable_row_major_load_workaround = bVar8;
      (psVar22->glsl).ovr_multiview_view_count = uVar9;
      (psVar22->glsl).vertex = VVar10;
      (psVar22->glsl).field_0x1f = uVar11;
      (psVar22->glsl).version = uVar12;
      (psVar22->glsl).es = bVar13;
      (psVar22->glsl).force_temporary = bVar14;
      *(undefined2 *)&(psVar22->glsl).field_0x6 = uVar15;
      (psVar22->glsl).force_recompile_max_debug_iterations = uVar16;
      (psVar22->glsl).vulkan_semantics = bVar17;
      (psVar22->glsl).separate_shader_objects = bVar18;
      (psVar22->glsl).flatten_multidimensional_arrays = bVar19;
      (psVar22->glsl).enable_420pack_extension = bVar20;
      this_01 = (CompilerMSL *)
                std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                ::get(&compiler->compiler);
      __src = spirv_cross::CompilerMSL::get_msl_options(this_01);
      psVar22 = std::
                unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
                operator->(&local_28);
      memcpy(&psVar22->msl,__src,0x8a);
    }
    psVar22 = std::
              unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
              get(&local_28);
    *(pointer *)
     opt._M_t.
     super___uniq_ptr_impl<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>.
     _M_t.
     super__Tuple_impl<0UL,_spvc_compiler_options_s_*,_std::default_delete<spvc_compiler_options_s>_>
     .super__Head_base<0UL,_spvc_compiler_options_s_*,_false>._M_head_impl = psVar22;
    psVar2 = compiler->context;
    std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
    unique_ptr<spvc_compiler_options_s,std::default_delete<spvc_compiler_options_s>,void>
              ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *)
               &e,&local_28);
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::push_back(&psVar2->allocations,
                (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)&e);
    std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
    ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                 *)&e);
    local_68 = 0;
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"Out of memory.",&local_61);
    spvc_context_s::report_error(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    compiler_local._4_4_ = SPVC_ERROR_OUT_OF_MEMORY;
    local_68 = 1;
  }
  std::unique_ptr<spvc_compiler_options_s,_std::default_delete<spvc_compiler_options_s>_>::
  ~unique_ptr(&local_28);
  if (local_68 == 0) {
    compiler_local._4_4_ = SPVC_SUCCESS;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_create_compiler_options(spvc_compiler compiler, spvc_compiler_options *options)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_compiler_options_s> opt(new (std::nothrow) spvc_compiler_options_s);
		if (!opt)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		opt->context = compiler->context;
		opt->backend_flags = 0;
		switch (compiler->backend)
		{
#if SPIRV_CROSS_C_API_MSL
		case SPVC_BACKEND_MSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_MSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerMSL *>(compiler->compiler.get())->get_common_options();
			opt->msl = static_cast<CompilerMSL *>(compiler->compiler.get())->get_msl_options();
			break;
#endif

#if SPIRV_CROSS_C_API_HLSL
		case SPVC_BACKEND_HLSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_HLSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerHLSL *>(compiler->compiler.get())->get_common_options();
			opt->hlsl = static_cast<CompilerHLSL *>(compiler->compiler.get())->get_hlsl_options();
			break;
#endif

#if SPIRV_CROSS_C_API_GLSL
		case SPVC_BACKEND_GLSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_GLSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerGLSL *>(compiler->compiler.get())->get_common_options();
			break;
#endif

		default:
			break;
		}

		*options = opt.get();
		compiler->context->allocations.push_back(std::move(opt));
	}